

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduling_tests.hpp
# Opt level: O2

void test_multiple_unit_tasks(void)

{
  task_handle *h;
  task_handle *this;
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  *__stat_loc;
  long lVar1;
  long lVar2;
  test __t;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> handles;
  test local_99;
  vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> local_98;
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  test::test(&local_99,"test_multiple_unit_tasks");
  __stat_loc = (helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                *)(long)gTaskCount;
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::vector
            (&local_98,(size_type)__stat_loc,(allocator_type *)&local_70);
  lVar1 = 0;
  for (lVar2 = 0;
      this = local_98.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
             _M_impl.super__Vector_impl_data._M_start, lVar2 < gTaskCount; lVar2 = lVar2 + 1) {
    std::__cxx11::to_string(&local_50,(int)lVar2);
    std::operator+(&local_70,"Fibonacci_",&local_50);
    oqpi::
    helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
    ::schedule_task<unsigned_long(&)(unsigned_long),unsigned_long_long_const&>
              (local_80,&local_70,fibonacci,&gValue);
    __stat_loc = local_80;
    oqpi::task_handle::operator=
              ((task_handle *)
               ((long)&((local_98.
                         super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                         _M_impl.super__Vector_impl_data._M_start)->spTask_).
                       super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar1),(task_handle *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = lVar1 + 0x10;
  }
  for (; this != local_98.super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>.
                 _M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    oqpi::task_handle::wait(this,__stat_loc);
  }
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::~vector(&local_98);
  test::~test(&local_99);
  return;
}

Assistant:

void test_multiple_unit_tasks()
{
    TEST_FUNC;

    std::vector<oqpi::task_handle> handles(gTaskCount);
    for (auto i = 0; i < gTaskCount; ++i)
    {
        handles[i] = oqpi_tk::schedule_task("Fibonacci_" + std::to_string(i), fibonacci, gValue);
    }
    for (auto &h : handles)
    {
        h.wait();
    }
}